

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  int iVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  RTCFilterFunctionN p_Var23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  NodeRef *pNVar31;
  int iVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  ulong uVar34;
  RTCRayN *pRVar35;
  ulong uVar36;
  undefined4 uVar37;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar38;
  long lVar39;
  size_t sVar40;
  ulong uVar41;
  uint uVar42;
  bool bVar43;
  bool bVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar56;
  float fVar59;
  undefined1 auVar49 [16];
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar73;
  float fVar74;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar78 [16];
  float fVar83;
  undefined1 auVar79 [16];
  float fVar84;
  float fVar85;
  float fVar91;
  float fVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar101;
  float fVar103;
  undefined1 auVar98 [16];
  float fVar102;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar107;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar108 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [16];
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar126 [16];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 local_b81;
  long local_b80;
  Scene *local_b78;
  float fStack_b70;
  float fStack_b6c;
  ulong local_b60;
  ulong local_b58;
  ulong local_b50;
  NodeRef *local_b48;
  RayK<4> *local_b40;
  ulong local_b38;
  ulong local_b30;
  float local_b28;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined8 local_b08;
  float fStack_b00;
  float fStack_afc;
  undefined4 local_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  undefined1 local_ae8 [16];
  undefined1 (*local_ad0) [16];
  ulong local_ac8;
  ulong local_ac0;
  NodeRef *local_ab8;
  ulong local_ab0;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar65 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar93 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar19 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar63 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar94 = fVar63 * 0.99999964;
  fVar95 = fVar76 * 0.99999964;
  fVar45 = fVar84 * 0.99999964;
  fVar63 = fVar63 * 1.0000004;
  fVar76 = fVar76 * 1.0000004;
  fVar84 = fVar84 * 1.0000004;
  local_b50 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_b60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar41 = local_b50 ^ 0x10;
  local_b38 = local_b58 ^ 0x10;
  local_ab0 = local_b60 ^ 0x10;
  iVar20 = (tray->tnear).field_0.i[k];
  iVar32 = (tray->tfar).field_0.i[k];
  auVar49._4_4_ = iVar32;
  auVar49._0_4_ = iVar32;
  auVar49._8_4_ = iVar32;
  auVar49._12_4_ = iVar32;
  local_ad0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar38 = local_b38;
  pNVar31 = stack + 1;
  local_b40 = ray;
  fVar148 = fVar65;
  fVar75 = fVar65;
  fVar46 = fVar65;
  fVar56 = fVar93;
  fVar59 = fVar93;
  fVar61 = fVar93;
  local_b30 = uVar41;
  local_b28 = fVar93;
  fStack_b24 = fVar93;
  fStack_b20 = fVar93;
  fStack_b1c = fVar93;
  local_b18 = fVar65;
  fStack_b14 = fVar65;
  fStack_b10 = fVar65;
  fStack_b0c = fVar65;
  do {
    local_ab8 = pNVar31;
    if (local_ab8 == stack) break;
    local_b48 = local_ab8 + -1;
    sVar40 = local_ab8[-1].ptr;
    do {
      if ((sVar40 & 8) == 0) {
        uVar33 = sVar40 & 0xfffffffffffffff0;
        fVar83 = *(float *)(local_b40 + k * 4 + 0x70);
        pfVar6 = (float *)(uVar33 + 0x80 + local_b50);
        pfVar1 = (float *)(uVar33 + 0x20 + local_b50);
        auVar87._0_4_ = ((*pfVar6 * fVar83 + *pfVar1) - fVar65) * fVar94;
        auVar87._4_4_ = ((pfVar6[1] * fVar83 + pfVar1[1]) - fVar148) * fVar94;
        auVar87._8_4_ = ((pfVar6[2] * fVar83 + pfVar1[2]) - fVar75) * fVar94;
        auVar87._12_4_ = ((pfVar6[3] * fVar83 + pfVar1[3]) - fVar46) * fVar94;
        auVar66._4_4_ = iVar20;
        auVar66._0_4_ = iVar20;
        auVar66._8_4_ = iVar20;
        auVar66._12_4_ = iVar20;
        pfVar6 = (float *)(uVar33 + 0x80 + local_b58);
        pfVar1 = (float *)(uVar33 + 0x20 + local_b58);
        auVar66 = maxps(auVar66,auVar87);
        auVar86._0_4_ = ((*pfVar6 * fVar83 + *pfVar1) - fVar93) * fVar95;
        auVar86._4_4_ = ((pfVar6[1] * fVar83 + pfVar1[1]) - fVar56) * fVar95;
        auVar86._8_4_ = ((pfVar6[2] * fVar83 + pfVar1[2]) - fVar59) * fVar95;
        auVar86._12_4_ = ((pfVar6[3] * fVar83 + pfVar1[3]) - fVar61) * fVar95;
        pfVar6 = (float *)(uVar33 + 0x80 + local_b60);
        pfVar1 = (float *)(uVar33 + 0x20 + local_b60);
        auVar90._0_4_ = ((*pfVar6 * fVar83 + *pfVar1) - fVar19) * fVar45;
        auVar90._4_4_ = ((pfVar6[1] * fVar83 + pfVar1[1]) - fVar19) * fVar45;
        auVar90._8_4_ = ((pfVar6[2] * fVar83 + pfVar1[2]) - fVar19) * fVar45;
        auVar90._12_4_ = ((pfVar6[3] * fVar83 + pfVar1[3]) - fVar19) * fVar45;
        auVar87 = maxps(auVar86,auVar90);
        auVar66 = maxps(auVar66,auVar87);
        pfVar6 = (float *)(uVar33 + 0x80 + uVar41);
        pfVar1 = (float *)(uVar33 + 0x20 + uVar41);
        auVar88._0_4_ = ((*pfVar6 * fVar83 + *pfVar1) - fVar65) * fVar63;
        auVar88._4_4_ = ((pfVar6[1] * fVar83 + pfVar1[1]) - fVar148) * fVar63;
        auVar88._8_4_ = ((pfVar6[2] * fVar83 + pfVar1[2]) - fVar75) * fVar63;
        auVar88._12_4_ = ((pfVar6[3] * fVar83 + pfVar1[3]) - fVar46) * fVar63;
        auVar87 = minps(auVar49,auVar88);
        pfVar7 = (float *)(uVar33 + 0x80 + uVar38);
        pfVar1 = (float *)(uVar33 + 0x20 + uVar38);
        pfVar8 = (float *)(uVar33 + 0x80 + local_ab0);
        pfVar6 = (float *)(uVar33 + 0x20 + local_ab0);
        auVar89._0_4_ = ((*pfVar7 * fVar83 + *pfVar1) - fVar93) * fVar76;
        auVar89._4_4_ = ((pfVar7[1] * fVar83 + pfVar1[1]) - fVar56) * fVar76;
        auVar89._8_4_ = ((pfVar7[2] * fVar83 + pfVar1[2]) - fVar59) * fVar76;
        auVar89._12_4_ = ((pfVar7[3] * fVar83 + pfVar1[3]) - fVar61) * fVar76;
        auVar98._0_4_ = ((*pfVar8 * fVar83 + *pfVar6) - fVar19) * fVar84;
        auVar98._4_4_ = ((pfVar8[1] * fVar83 + pfVar6[1]) - fVar19) * fVar84;
        auVar98._8_4_ = ((pfVar8[2] * fVar83 + pfVar6[2]) - fVar19) * fVar84;
        auVar98._12_4_ = ((pfVar8[3] * fVar83 + pfVar6[3]) - fVar19) * fVar84;
        auVar90 = minps(auVar89,auVar98);
        auVar87 = minps(auVar87,auVar90);
        bVar43 = auVar66._0_4_ <= auVar87._0_4_;
        bVar44 = auVar66._4_4_ <= auVar87._4_4_;
        bVar24 = auVar66._8_4_ <= auVar87._8_4_;
        bVar25 = auVar66._12_4_ <= auVar87._12_4_;
        if (((uint)sVar40 & 7) == 6) {
          bVar43 = (fVar83 < *(float *)(uVar33 + 0xf0) && *(float *)(uVar33 + 0xe0) <= fVar83) &&
                   bVar43;
          bVar44 = (fVar83 < *(float *)(uVar33 + 0xf4) && *(float *)(uVar33 + 0xe4) <= fVar83) &&
                   bVar44;
          bVar24 = (fVar83 < *(float *)(uVar33 + 0xf8) && *(float *)(uVar33 + 0xe8) <= fVar83) &&
                   bVar24;
          bVar25 = (fVar83 < *(float *)(uVar33 + 0xfc) && *(float *)(uVar33 + 0xec) <= fVar83) &&
                   bVar25;
        }
        auVar67._0_4_ = (uint)bVar43 * -0x80000000;
        auVar67._4_4_ = (uint)bVar44 * -0x80000000;
        auVar67._8_4_ = (uint)bVar24 * -0x80000000;
        auVar67._12_4_ = (uint)bVar25 * -0x80000000;
        uVar37 = movmskps((int)unaff_RBX,auVar67);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar37);
      }
      if ((sVar40 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar42 = 4;
        }
        else {
          uVar33 = sVar40 & 0xfffffffffffffff0;
          lVar39 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar42 = 0;
          sVar40 = *(size_t *)(uVar33 + lVar39 * 8);
          uVar36 = unaff_RBX - 1 & unaff_RBX;
          if (uVar36 != 0) {
            local_b48->ptr = sVar40;
            lVar39 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar34 = uVar36 - 1;
            while( true ) {
              local_b48 = local_b48 + 1;
              sVar40 = *(size_t *)(uVar33 + lVar39 * 8);
              uVar34 = uVar34 & uVar36;
              if (uVar34 == 0) break;
              local_b48->ptr = sVar40;
              lVar39 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              uVar36 = uVar34 - 1;
            }
          }
        }
      }
      else {
        uVar42 = 6;
      }
    } while (uVar42 == 0);
    uVar33 = uVar38;
    if (uVar42 == 6) {
      uVar42 = 0;
      local_ac8 = (ulong)((uint)sVar40 & 0xf) - 8;
      bVar43 = local_ac8 != 0;
      if (bVar43) {
        uVar36 = sVar40 & 0xfffffffffffffff0;
        local_ac0 = 0;
        do {
          local_b80 = local_ac0 * 0x140;
          fVar65 = *(float *)(local_b40 + k * 4 + 0x70);
          pfVar9 = (float *)(uVar36 + 0x90 + local_b80);
          pfVar1 = (float *)(uVar36 + local_b80);
          pfVar10 = (float *)(uVar36 + 0xa0 + local_b80);
          pfVar6 = (float *)(uVar36 + 0x10 + local_b80);
          pfVar11 = (float *)(uVar36 + 0xb0 + local_b80);
          pfVar7 = (float *)(uVar36 + 0x20 + local_b80);
          pfVar12 = (float *)(uVar36 + 0xc0 + local_b80);
          pfVar8 = (float *)(uVar36 + 0x30 + local_b80);
          pfVar13 = (float *)(uVar36 + 0xd0 + local_b80);
          pfVar2 = (float *)(uVar36 + 0x40 + local_b80);
          pfVar14 = (float *)(uVar36 + 0xe0 + local_b80);
          pfVar3 = (float *)(uVar36 + 0x50 + local_b80);
          pfVar15 = (float *)(uVar36 + 0xf0 + local_b80);
          pfVar4 = (float *)(uVar36 + 0x60 + local_b80);
          pfVar16 = (float *)(uVar36 + 0x100 + local_b80);
          pfVar5 = (float *)(uVar36 + 0x70 + local_b80);
          pfVar17 = (float *)(uVar36 + 0x110 + local_b80);
          pfVar18 = (float *)(uVar36 + 0x80 + local_b80);
          fVar93 = *(float *)(local_b40 + k * 4);
          fVar148 = *(float *)(local_b40 + k * 4 + 0x10);
          fVar75 = *(float *)(local_b40 + k * 4 + 0x20);
          fVar77 = (*pfVar9 * fVar65 + *pfVar1) - fVar93;
          fVar80 = (pfVar9[1] * fVar65 + pfVar1[1]) - fVar93;
          fVar81 = (pfVar9[2] * fVar65 + pfVar1[2]) - fVar93;
          fVar82 = (pfVar9[3] * fVar65 + pfVar1[3]) - fVar93;
          fVar139 = (*pfVar10 * fVar65 + *pfVar6) - fVar148;
          fVar140 = (pfVar10[1] * fVar65 + pfVar6[1]) - fVar148;
          fVar141 = (pfVar10[2] * fVar65 + pfVar6[2]) - fVar148;
          fVar142 = (pfVar10[3] * fVar65 + pfVar6[3]) - fVar148;
          fVar149 = (*pfVar11 * fVar65 + *pfVar7) - fVar75;
          fVar150 = (pfVar11[1] * fVar65 + pfVar7[1]) - fVar75;
          fVar151 = (pfVar11[2] * fVar65 + pfVar7[2]) - fVar75;
          fVar152 = (pfVar11[3] * fVar65 + pfVar7[3]) - fVar75;
          fVar46 = (*pfVar12 * fVar65 + *pfVar8) - fVar93;
          fVar56 = (pfVar12[1] * fVar65 + pfVar8[1]) - fVar93;
          fVar59 = (pfVar12[2] * fVar65 + pfVar8[2]) - fVar93;
          fVar61 = (pfVar12[3] * fVar65 + pfVar8[3]) - fVar93;
          fVar107 = (*pfVar13 * fVar65 + *pfVar2) - fVar148;
          fVar109 = (pfVar13[1] * fVar65 + pfVar2[1]) - fVar148;
          fVar110 = (pfVar13[2] * fVar65 + pfVar2[2]) - fVar148;
          fVar111 = (pfVar13[3] * fVar65 + pfVar2[3]) - fVar148;
          fVar135 = (*pfVar14 * fVar65 + *pfVar3) - fVar75;
          fVar136 = (pfVar14[1] * fVar65 + pfVar3[1]) - fVar75;
          fVar137 = (pfVar14[2] * fVar65 + pfVar3[2]) - fVar75;
          fVar138 = (pfVar14[3] * fVar65 + pfVar3[3]) - fVar75;
          fVar85 = (*pfVar15 * fVar65 + *pfVar4) - fVar93;
          fVar91 = (pfVar15[1] * fVar65 + pfVar4[1]) - fVar93;
          fVar92 = (pfVar15[2] * fVar65 + pfVar4[2]) - fVar93;
          fVar93 = (pfVar15[3] * fVar65 + pfVar4[3]) - fVar93;
          fVar143 = (*pfVar16 * fVar65 + *pfVar5) - fVar148;
          fVar146 = (pfVar16[1] * fVar65 + pfVar5[1]) - fVar148;
          fVar147 = (pfVar16[2] * fVar65 + pfVar5[2]) - fVar148;
          fVar148 = (pfVar16[3] * fVar65 + pfVar5[3]) - fVar148;
          fVar64 = (fVar65 * *pfVar17 + *pfVar18) - fVar75;
          fVar73 = (fVar65 * pfVar17[1] + pfVar18[1]) - fVar75;
          fVar74 = (fVar65 * pfVar17[2] + pfVar18[2]) - fVar75;
          fVar75 = (fVar65 * pfVar17[3] + pfVar18[3]) - fVar75;
          fVar125 = fVar85 - fVar77;
          fVar127 = fVar91 - fVar80;
          fVar128 = fVar92 - fVar81;
          fVar129 = fVar93 - fVar82;
          fVar153 = fVar143 - fVar139;
          fVar155 = fVar146 - fVar140;
          fVar157 = fVar147 - fVar141;
          fVar159 = fVar148 - fVar142;
          fVar130 = fVar64 - fVar149;
          fVar132 = fVar73 - fVar150;
          fVar133 = fVar74 - fVar151;
          fVar134 = fVar75 - fVar152;
          fStack_b70 = *(float *)(local_b40 + k * 4 + 0x50);
          fVar83 = *(float *)(local_b40 + k * 4 + 0x60);
          fStack_af4 = *(float *)(local_b40 + k * 4 + 0x40);
          fVar112 = (fVar153 * (fVar64 + fVar149) - (fVar143 + fVar139) * fVar130) * fStack_af4 +
                    ((fVar85 + fVar77) * fVar130 - (fVar64 + fVar149) * fVar125) * fStack_b70 +
                    (fVar125 * (fVar143 + fVar139) - (fVar85 + fVar77) * fVar153) * fVar83;
          fVar113 = (fVar155 * (fVar73 + fVar150) - (fVar146 + fVar140) * fVar132) * fStack_af4 +
                    ((fVar91 + fVar80) * fVar132 - (fVar73 + fVar150) * fVar127) * fStack_b70 +
                    (fVar127 * (fVar146 + fVar140) - (fVar91 + fVar80) * fVar155) * fVar83;
          fVar114 = (fVar157 * (fVar74 + fVar151) - (fVar147 + fVar141) * fVar133) * fStack_af4 +
                    ((fVar92 + fVar81) * fVar133 - (fVar74 + fVar151) * fVar128) * fStack_b70 +
                    (fVar128 * (fVar147 + fVar141) - (fVar92 + fVar81) * fVar157) * fVar83;
          fVar115 = (fVar159 * (fVar75 + fVar152) - (fVar148 + fVar142) * fVar134) * fStack_af4 +
                    ((fVar93 + fVar82) * fVar134 - (fVar75 + fVar152) * fVar129) * fStack_b70 +
                    (fVar129 * (fVar148 + fVar142) - (fVar93 + fVar82) * fVar159) * fVar83;
          fVar96 = fVar77 - fVar46;
          fVar101 = fVar80 - fVar56;
          fVar103 = fVar81 - fVar59;
          fVar105 = fVar82 - fVar61;
          fVar120 = fVar139 - fVar107;
          fVar122 = fVar140 - fVar109;
          fVar123 = fVar141 - fVar110;
          fVar124 = fVar142 - fVar111;
          fVar47 = fVar149 - fVar135;
          fVar57 = fVar150 - fVar136;
          fVar60 = fVar151 - fVar137;
          fVar62 = fVar152 - fVar138;
          fVar116 = (fVar120 * (fVar149 + fVar135) - (fVar139 + fVar107) * fVar47) * fStack_af4 +
                    ((fVar77 + fVar46) * fVar47 - (fVar149 + fVar135) * fVar96) * fStack_b70 +
                    (fVar96 * (fVar139 + fVar107) - (fVar77 + fVar46) * fVar120) * fVar83;
          fVar117 = (fVar122 * (fVar150 + fVar136) - (fVar140 + fVar109) * fVar57) * fStack_af4 +
                    ((fVar80 + fVar56) * fVar57 - (fVar150 + fVar136) * fVar101) * fStack_b70 +
                    (fVar101 * (fVar140 + fVar109) - (fVar80 + fVar56) * fVar122) * fVar83;
          fVar118 = (fVar123 * (fVar151 + fVar137) - (fVar141 + fVar110) * fVar60) * fStack_af4 +
                    ((fVar81 + fVar59) * fVar60 - (fVar151 + fVar137) * fVar103) * fStack_b70 +
                    (fVar103 * (fVar141 + fVar110) - (fVar81 + fVar59) * fVar123) * fVar83;
          fVar119 = (fVar124 * (fVar152 + fVar138) - (fVar142 + fVar111) * fVar62) * fStack_af4 +
                    ((fVar82 + fVar61) * fVar62 - (fVar152 + fVar138) * fVar105) * fStack_b70 +
                    (fVar105 * (fVar142 + fVar111) - (fVar82 + fVar61) * fVar124) * fVar83;
          fVar97 = fVar46 - fVar85;
          fVar102 = fVar56 - fVar91;
          fVar104 = fVar59 - fVar92;
          fVar106 = fVar61 - fVar93;
          fVar154 = fVar107 - fVar143;
          fVar156 = fVar109 - fVar146;
          fVar158 = fVar110 - fVar147;
          fVar160 = fVar111 - fVar148;
          fVar48 = fVar135 - fVar64;
          fVar58 = fVar136 - fVar73;
          fStack_b00 = fVar137 - fVar74;
          fStack_afc = fVar138 - fVar75;
          local_b08 = CONCAT44(fVar58,fVar48);
          auVar78._0_4_ =
               (fVar154 * (fVar64 + fVar135) - (fVar143 + fVar107) * fVar48) * fStack_af4 +
               ((fVar85 + fVar46) * fVar48 - (fVar64 + fVar135) * fVar97) * fStack_b70 +
               (fVar97 * (fVar143 + fVar107) - (fVar85 + fVar46) * fVar154) * fVar83;
          auVar78._4_4_ =
               (fVar156 * (fVar73 + fVar136) - (fVar146 + fVar109) * fVar58) * fStack_af4 +
               ((fVar91 + fVar56) * fVar58 - (fVar73 + fVar136) * fVar102) * fStack_b70 +
               (fVar102 * (fVar146 + fVar109) - (fVar91 + fVar56) * fVar156) * fVar83;
          auVar78._8_4_ =
               (fVar158 * (fVar74 + fVar137) - (fVar147 + fVar110) * fStack_b00) * fStack_af4 +
               ((fVar92 + fVar59) * fStack_b00 - (fVar74 + fVar137) * fVar104) * fStack_b70 +
               (fVar104 * (fVar147 + fVar110) - (fVar92 + fVar59) * fVar158) * fVar83;
          auVar78._12_4_ =
               (fVar160 * (fVar75 + fVar138) - (fVar148 + fVar111) * fStack_afc) * fStack_af4 +
               ((fVar93 + fVar61) * fStack_afc - (fVar75 + fVar138) * fVar106) * fStack_b70 +
               (fVar106 * (fVar148 + fVar111) - (fVar93 + fVar61) * fVar160) * fVar83;
          fVar64 = fVar112 + fVar116 + auVar78._0_4_;
          fVar73 = fVar113 + fVar117 + auVar78._4_4_;
          fVar74 = fVar114 + fVar118 + auVar78._8_4_;
          fVar85 = fVar115 + fVar119 + auVar78._12_4_;
          auVar50._4_4_ = fVar113;
          auVar50._0_4_ = fVar112;
          auVar50._8_4_ = fVar114;
          auVar50._12_4_ = fVar115;
          auVar27._4_4_ = fVar117;
          auVar27._0_4_ = fVar116;
          auVar27._8_4_ = fVar118;
          auVar27._12_4_ = fVar119;
          auVar66 = minps(auVar50,auVar27);
          auVar66 = minps(auVar66,auVar78);
          auVar144._4_4_ = fVar113;
          auVar144._0_4_ = fVar112;
          auVar144._8_4_ = fVar114;
          auVar144._12_4_ = fVar115;
          auVar28._4_4_ = fVar117;
          auVar28._0_4_ = fVar116;
          auVar28._8_4_ = fVar118;
          auVar28._12_4_ = fVar119;
          auVar87 = maxps(auVar144,auVar28);
          auVar87 = maxps(auVar87,auVar78);
          fVar65 = ABS(fVar64) * 1.1920929e-07;
          fVar93 = ABS(fVar73) * 1.1920929e-07;
          fVar148 = ABS(fVar74) * 1.1920929e-07;
          fVar75 = ABS(fVar85) * 1.1920929e-07;
          auVar145._4_4_ = -(uint)(auVar87._4_4_ <= fVar93);
          auVar145._0_4_ = -(uint)(auVar87._0_4_ <= fVar65);
          auVar145._8_4_ = -(uint)(auVar87._8_4_ <= fVar148);
          auVar145._12_4_ = -(uint)(auVar87._12_4_ <= fVar75);
          auVar51._4_4_ = -(uint)(-fVar93 <= auVar66._4_4_);
          auVar51._0_4_ = -(uint)(-fVar65 <= auVar66._0_4_);
          auVar51._8_4_ = -(uint)(-fVar148 <= auVar66._8_4_);
          auVar51._12_4_ = -(uint)(-fVar75 <= auVar66._12_4_);
          auVar145 = auVar145 | auVar51;
          iVar32 = movmskps((int)&local_b81,auVar145);
          fVar65 = local_b18;
          fVar148 = fStack_b14;
          fVar75 = fStack_b10;
          fVar46 = fStack_b0c;
          fVar93 = local_b28;
          fVar56 = fStack_b24;
          fVar59 = fStack_b20;
          fVar61 = fStack_b1c;
          if (iVar32 != 0) {
            auVar121._0_4_ = fVar120 * fVar48 - fVar154 * fVar47;
            auVar121._4_4_ = fVar122 * fVar58 - fVar156 * fVar57;
            auVar121._8_4_ = fVar123 * fStack_b00 - fVar158 * fVar60;
            auVar121._12_4_ = fVar124 * fStack_afc - fVar160 * fVar62;
            auVar52._4_4_ = -(uint)(ABS(fVar122 * fVar132) < ABS(fVar156 * fVar57));
            auVar52._0_4_ = -(uint)(ABS(fVar120 * fVar130) < ABS(fVar154 * fVar47));
            auVar52._8_4_ = -(uint)(ABS(fVar123 * fVar133) < ABS(fVar158 * fVar60));
            auVar52._12_4_ = -(uint)(ABS(fVar124 * fVar134) < ABS(fVar160 * fVar62));
            auVar26._4_4_ = fVar155 * fVar57 - fVar122 * fVar132;
            auVar26._0_4_ = fVar153 * fVar47 - fVar120 * fVar130;
            auVar26._8_4_ = fVar157 * fVar60 - fVar123 * fVar133;
            auVar26._12_4_ = fVar159 * fVar62 - fVar124 * fVar134;
            local_898 = blendvps(auVar121,auVar26,auVar52);
            auVar131._0_4_ = fVar97 * fVar47 - fVar96 * fVar48;
            auVar131._4_4_ = fVar102 * fVar57 - fVar101 * fVar58;
            auVar131._8_4_ = fVar104 * fVar60 - fVar103 * fStack_b00;
            auVar131._12_4_ = fVar106 * fVar62 - fVar105 * fStack_afc;
            auVar53._4_4_ = -(uint)(ABS(fVar127 * fVar57) < ABS(fVar101 * fVar58));
            auVar53._0_4_ = -(uint)(ABS(fVar125 * fVar47) < ABS(fVar96 * fVar48));
            auVar53._8_4_ = -(uint)(ABS(fVar128 * fVar60) < ABS(fVar103 * fStack_b00));
            auVar53._12_4_ = -(uint)(ABS(fVar129 * fVar62) < ABS(fVar105 * fStack_afc));
            auVar29._4_4_ = fVar132 * fVar101 - fVar127 * fVar57;
            auVar29._0_4_ = fVar130 * fVar96 - fVar125 * fVar47;
            auVar29._8_4_ = fVar133 * fVar103 - fVar128 * fVar60;
            auVar29._12_4_ = fVar134 * fVar105 - fVar129 * fVar62;
            local_888 = blendvps(auVar131,auVar29,auVar53);
            auVar99._0_4_ = fVar125 * fVar120 - fVar96 * fVar153;
            auVar99._4_4_ = fVar127 * fVar122 - fVar101 * fVar155;
            auVar99._8_4_ = fVar128 * fVar123 - fVar103 * fVar157;
            auVar99._12_4_ = fVar129 * fVar124 - fVar105 * fVar159;
            auVar126._0_4_ = fVar96 * fVar154 - fVar97 * fVar120;
            auVar126._4_4_ = fVar101 * fVar156 - fVar102 * fVar122;
            auVar126._8_4_ = fVar103 * fVar158 - fVar104 * fVar123;
            auVar126._12_4_ = fVar105 * fVar160 - fVar106 * fVar124;
            auVar54._4_4_ = -(uint)(ABS(fVar101 * fVar155) < ABS(fVar102 * fVar122));
            auVar54._0_4_ = -(uint)(ABS(fVar96 * fVar153) < ABS(fVar97 * fVar120));
            auVar54._8_4_ = -(uint)(ABS(fVar103 * fVar157) < ABS(fVar104 * fVar123));
            auVar54._12_4_ = -(uint)(ABS(fVar105 * fVar159) < ABS(fVar106 * fVar124));
            local_878 = blendvps(auVar126,auVar99,auVar54);
            fVar47 = fStack_af4 * local_898._0_4_ +
                     fStack_b70 * local_888._0_4_ + fVar83 * local_878._0_4_;
            fVar48 = fStack_af4 * local_898._4_4_ +
                     fStack_b70 * local_888._4_4_ + fVar83 * local_878._4_4_;
            fVar57 = fStack_af4 * local_898._8_4_ +
                     fStack_b70 * local_888._8_4_ + fVar83 * local_878._8_4_;
            fVar83 = fStack_af4 * local_898._12_4_ +
                     fStack_b70 * local_888._12_4_ + fVar83 * local_878._12_4_;
            auVar79._0_4_ = fVar47 + fVar47;
            auVar79._4_4_ = fVar48 + fVar48;
            auVar79._8_4_ = fVar57 + fVar57;
            auVar79._12_4_ = fVar83 + fVar83;
            auVar68._0_4_ = fVar149 * local_878._0_4_;
            auVar68._4_4_ = fVar150 * local_878._4_4_;
            auVar68._8_4_ = fVar151 * local_878._8_4_;
            auVar68._12_4_ = fVar152 * local_878._12_4_;
            fVar58 = fVar77 * local_898._0_4_ + fVar139 * local_888._0_4_ + auVar68._0_4_;
            fVar60 = fVar80 * local_898._4_4_ + fVar140 * local_888._4_4_ + auVar68._4_4_;
            fVar62 = fVar81 * local_898._8_4_ + fVar141 * local_888._8_4_ + auVar68._8_4_;
            fVar77 = fVar82 * local_898._12_4_ + fVar142 * local_888._12_4_ + auVar68._12_4_;
            auVar66 = rcpps(auVar68,auVar79);
            fVar83 = auVar66._0_4_;
            fVar47 = auVar66._4_4_;
            fVar48 = auVar66._8_4_;
            fVar57 = auVar66._12_4_;
            local_8a8._0_4_ = ((1.0 - auVar79._0_4_ * fVar83) * fVar83 + fVar83) * (fVar58 + fVar58)
            ;
            local_8a8._4_4_ = ((1.0 - auVar79._4_4_ * fVar47) * fVar47 + fVar47) * (fVar60 + fVar60)
            ;
            local_8a8._8_4_ = ((1.0 - auVar79._8_4_ * fVar48) * fVar48 + fVar48) * (fVar62 + fVar62)
            ;
            local_8a8._12_4_ =
                 ((1.0 - auVar79._12_4_ * fVar57) * fVar57 + fVar57) * (fVar77 + fVar77);
            fVar83 = *(float *)(local_b40 + k * 4 + 0x80);
            fVar47 = *(float *)(local_b40 + k * 4 + 0x30);
            auVar69._0_4_ =
                 -(uint)(local_8a8._0_4_ <= fVar83 && fVar47 <= local_8a8._0_4_) & auVar145._0_4_;
            auVar69._4_4_ =
                 -(uint)(local_8a8._4_4_ <= fVar83 && fVar47 <= local_8a8._4_4_) & auVar145._4_4_;
            auVar69._8_4_ =
                 -(uint)(local_8a8._8_4_ <= fVar83 && fVar47 <= local_8a8._8_4_) & auVar145._8_4_;
            auVar69._12_4_ =
                 -(uint)(local_8a8._12_4_ <= fVar83 && fVar47 <= local_8a8._12_4_) & auVar145._12_4_
            ;
            iVar32 = movmskps(iVar32,auVar69);
            if (iVar32 != 0) {
              auVar70._0_4_ = auVar69._0_4_ & -(uint)(auVar79._0_4_ != 0.0);
              auVar70._4_4_ = auVar69._4_4_ & -(uint)(auVar79._4_4_ != 0.0);
              auVar70._8_4_ = auVar69._8_4_ & -(uint)(auVar79._8_4_ != 0.0);
              auVar70._12_4_ = auVar69._12_4_ & -(uint)(auVar79._12_4_ != 0.0);
              iVar32 = movmskps((int)uVar38,auVar70);
              uVar38 = CONCAT44((int)(uVar38 >> 0x20),iVar32);
              if (iVar32 != 0) {
                local_b80 = local_b80 + uVar36;
                auVar30._4_4_ = fVar73;
                auVar30._0_4_ = fVar64;
                auVar30._8_4_ = fVar74;
                auVar30._12_4_ = fVar85;
                local_b78 = context->scene;
                auVar66 = rcpps(local_8a8,auVar30);
                fVar83 = auVar66._0_4_;
                fVar47 = auVar66._4_4_;
                fVar48 = auVar66._8_4_;
                fVar57 = auVar66._12_4_;
                fVar83 = (float)(-(uint)(1e-18 <= ABS(fVar64)) &
                                (uint)(((float)DAT_01feca10 - fVar64 * fVar83) * fVar83 + fVar83));
                fVar47 = (float)(-(uint)(1e-18 <= ABS(fVar73)) &
                                (uint)((DAT_01feca10._4_4_ - fVar73 * fVar47) * fVar47 + fVar47));
                fVar48 = (float)(-(uint)(1e-18 <= ABS(fVar74)) &
                                (uint)((DAT_01feca10._8_4_ - fVar74 * fVar48) * fVar48 + fVar48));
                fVar57 = (float)(-(uint)(1e-18 <= ABS(fVar85)) &
                                (uint)((DAT_01feca10._12_4_ - fVar85 * fVar57) * fVar57 + fVar57));
                auVar100._0_4_ = fVar112 * fVar83;
                auVar100._4_4_ = fVar113 * fVar47;
                auVar100._8_4_ = fVar114 * fVar48;
                auVar100._12_4_ = fVar115 * fVar57;
                local_8c8 = minps(auVar100,_DAT_01feca10);
                auVar108._0_4_ = fVar83 * fVar116;
                auVar108._4_4_ = fVar47 * fVar117;
                auVar108._8_4_ = fVar48 * fVar118;
                auVar108._12_4_ = fVar57 * fVar119;
                local_8b8 = minps(auVar108,_DAT_01feca10);
                fStack_b6c = fStack_b70;
                fStack_af0 = fStack_af4;
                fStack_aec = fStack_af4;
                do {
                  uVar41 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                    }
                  }
                  local_808 = *(uint *)(local_b80 + 0x120 + uVar41 * 4);
                  pGVar22 = (local_b78->geometries).items[local_808].ptr;
                  if ((pGVar22->mask & *(uint *)(local_b40 + k * 4 + 0x90)) == 0) {
                    uVar38 = uVar38 ^ 1L << (uVar41 & 0x3f);
                    bVar44 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar22->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar44 = false;
                  }
                  else {
                    local_af8 = *(undefined4 *)(local_b40 + k * 4 + 0x80);
                    local_838 = *(undefined4 *)(local_8c8 + uVar41 * 4);
                    uVar37 = *(undefined4 *)(local_8b8 + uVar41 * 4);
                    *(undefined4 *)(local_b40 + k * 4 + 0x80) =
                         *(undefined4 *)(local_8a8 + uVar41 * 4);
                    args.context = context->user;
                    uVar21 = *(undefined4 *)(local_b80 + 0x130 + uVar41 * 4);
                    local_818._4_4_ = uVar21;
                    local_818._0_4_ = uVar21;
                    local_818._8_4_ = uVar21;
                    local_818._12_4_ = uVar21;
                    local_828._4_4_ = uVar37;
                    local_828._0_4_ = uVar37;
                    local_828._8_4_ = uVar37;
                    local_828._12_4_ = uVar37;
                    uVar37 = *(undefined4 *)(local_898 + uVar41 * 4);
                    uVar21 = *(undefined4 *)(local_888 + uVar41 * 4);
                    local_848 = *(undefined4 *)(local_878 + uVar41 * 4);
                    local_858._4_4_ = uVar21;
                    local_858._0_4_ = uVar21;
                    local_858._8_4_ = uVar21;
                    local_858._12_4_ = uVar21;
                    local_868[0] = (RTCHitN)(char)uVar37;
                    local_868[1] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar37;
                    local_868[5] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar37;
                    local_868[9] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar37;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar37 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar37 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar37 >> 0x18);
                    uStack_844 = local_848;
                    uStack_840 = local_848;
                    uStack_83c = local_848;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_7f8 = (args.context)->instID[0];
                    uStack_7f4 = local_7f8;
                    uStack_7f0 = local_7f8;
                    uStack_7ec = local_7f8;
                    local_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = local_7e8;
                    uStack_7e0 = local_7e8;
                    uStack_7dc = local_7e8;
                    local_ae8 = *local_ad0;
                    args.valid = (int *)local_ae8;
                    args.geometryUserPtr = pGVar22->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    pRVar35 = (RTCRayN *)pGVar22->occlusionFilterN;
                    args.ray = (RTCRayN *)local_b40;
                    if (pRVar35 != (RTCRayN *)0x0) {
                      local_b08 = k;
                      pRVar35 = (RTCRayN *)(*(code *)pRVar35)(&args);
                      k = local_b08;
                      fVar65 = local_b18;
                      fVar148 = fStack_b14;
                      fVar75 = fStack_b10;
                      fVar46 = fStack_b0c;
                      fVar93 = local_b28;
                      fVar56 = fStack_b24;
                      fVar59 = fStack_b20;
                      fVar61 = fStack_b1c;
                    }
                    if (local_ae8 == (undefined1  [16])0x0) {
                      auVar71._8_4_ = 0xffffffff;
                      auVar71._0_8_ = 0xffffffffffffffff;
                      auVar71._12_4_ = 0xffffffff;
                      auVar71 = auVar71 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var23 = context->args->filter;
                      if ((p_Var23 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var23)(&args);
                        fVar65 = local_b18;
                        fVar148 = fStack_b14;
                        fVar75 = fStack_b10;
                        fVar46 = fStack_b0c;
                        fVar93 = local_b28;
                        fVar56 = fStack_b24;
                        fVar59 = fStack_b20;
                        fVar61 = fStack_b1c;
                      }
                      auVar55._0_4_ = -(uint)(local_ae8._0_4_ == 0);
                      auVar55._4_4_ = -(uint)(local_ae8._4_4_ == 0);
                      auVar55._8_4_ = -(uint)(local_ae8._8_4_ == 0);
                      auVar55._12_4_ = -(uint)(local_ae8._12_4_ == 0);
                      auVar71 = auVar55 ^ _DAT_01febe20;
                      auVar66 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar55);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar66;
                      pRVar35 = args.ray;
                    }
                    auVar72._0_4_ = auVar71._0_4_ << 0x1f;
                    auVar72._4_4_ = auVar71._4_4_ << 0x1f;
                    auVar72._8_4_ = auVar71._8_4_ << 0x1f;
                    auVar72._12_4_ = auVar71._12_4_ << 0x1f;
                    iVar32 = movmskps((int)pRVar35,auVar72);
                    bVar44 = iVar32 == 0;
                    if (bVar44) {
                      *(undefined4 *)(local_b40 + k * 4 + 0x80) = local_af8;
                      uVar38 = uVar38 ^ 1L << (uVar41 & 0x3f);
                    }
                  }
                  if (!bVar44) {
                    uVar33 = local_b38;
                    uVar41 = local_b30;
                    if (bVar43) {
                      *(undefined4 *)(local_b40 + k * 4 + 0x80) = 0xff800000;
                      uVar42 = 1;
                    }
                    goto LAB_002781cf;
                  }
                } while (uVar38 != 0);
                uVar38 = 0;
              }
            }
          }
          local_ac0 = local_ac0 + 1;
          bVar43 = local_ac0 < local_ac8;
          uVar33 = local_b38;
          uVar41 = local_b30;
        } while (local_ac0 != local_ac8);
      }
    }
LAB_002781cf:
    uVar38 = uVar33;
    pNVar31 = local_b48;
  } while ((uVar42 & 3) == 0);
  return local_ab8 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }